

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O0

int fi(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *flagvalue;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunindextype i;
  sunrealtype *f_w;
  sunrealtype *f_v;
  sunrealtype *f_u;
  sunrealtype *y_w;
  sunrealtype *y_v;
  sunrealtype *y_u;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype a;
  sunindextype N;
  UserData userdata;
  undefined8 in_stack_ffffffffffffff78;
  int opt;
  long lVar11;
  char *pcVar12;
  void *flagvalue_00;
  int local_4;
  
  lVar4 = *in_RDX;
  dVar1 = (double)in_RDX[2];
  dVar2 = (double)in_RDX[3];
  dVar3 = (double)in_RDX[7];
  flagvalue_00 = (void *)0x0;
  pcVar12 = (char *)0x0;
  uVar6 = N_VGetSubvector_ManyVector(in_RDI,0);
  lVar7 = N_VGetArrayPointer(uVar6);
  opt = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  iVar5 = check_flag(flagvalue_00,pcVar12,opt);
  if (iVar5 == 0) {
    uVar6 = N_VGetSubvector_ManyVector(in_RDI,1);
    lVar8 = N_VGetArrayPointer(uVar6);
    iVar5 = check_flag(flagvalue_00,pcVar12,opt);
    if (iVar5 == 0) {
      uVar6 = N_VGetSubvector_ManyVector(in_RDI,2);
      lVar9 = N_VGetArrayPointer(uVar6);
      iVar5 = check_flag(flagvalue_00,pcVar12,opt);
      if (iVar5 == 0) {
        uVar6 = N_VGetSubvector_ManyVector(in_RSI,0);
        puVar10 = (undefined8 *)N_VGetArrayPointer(uVar6);
        iVar5 = check_flag(flagvalue_00,pcVar12,opt);
        if (iVar5 == 0) {
          uVar6 = N_VGetSubvector_ManyVector(in_RSI,1);
          flagvalue = (undefined8 *)N_VGetArrayPointer(uVar6);
          iVar5 = check_flag(flagvalue,pcVar12,opt);
          if (iVar5 == 0) {
            uVar6 = N_VGetSubvector_ManyVector(in_RSI,2);
            pcVar12 = (char *)N_VGetArrayPointer(uVar6);
            iVar5 = check_flag(flagvalue,pcVar12,opt);
            if (iVar5 == 0) {
              N_VConst(in_RSI);
              for (lVar11 = 1; lVar11 < lVar4 + -1; lVar11 = lVar11 + 1) {
                puVar10[lVar11] =
                     *(double *)(lVar8 + lVar11 * 8) * *(double *)(lVar7 + lVar11 * 8) *
                     *(double *)(lVar7 + lVar11 * 8) +
                     -(*(double *)(lVar9 + lVar11 * 8) + 1.0) * *(double *)(lVar7 + lVar11 * 8) +
                     dVar1;
                flagvalue[lVar11] =
                     *(double *)(lVar9 + lVar11 * 8) * *(double *)(lVar7 + lVar11 * 8) +
                     -(*(double *)(lVar8 + lVar11 * 8) * *(double *)(lVar7 + lVar11 * 8) *
                      *(double *)(lVar7 + lVar11 * 8));
                *(double *)(pcVar12 + lVar11 * 8) =
                     -*(double *)(lVar9 + lVar11 * 8) * *(double *)(lVar7 + lVar11 * 8) +
                     (dVar2 - *(double *)(lVar9 + lVar11 * 8)) / dVar3;
              }
              pcVar12[0] = '\0';
              pcVar12[1] = '\0';
              pcVar12[2] = '\0';
              pcVar12[3] = '\0';
              pcVar12[4] = '\0';
              pcVar12[5] = '\0';
              pcVar12[6] = '\0';
              pcVar12[7] = '\0';
              *flagvalue = 0;
              *puVar10 = 0;
              pcVar12 = pcVar12 + (lVar4 + -1) * 8;
              pcVar12[0] = '\0';
              pcVar12[1] = '\0';
              pcVar12[2] = '\0';
              pcVar12[3] = '\0';
              pcVar12[4] = '\0';
              pcVar12[5] = '\0';
              pcVar12[6] = '\0';
              pcVar12[7] = '\0';
              flagvalue[lVar4 + -1] = 0;
              puVar10[lVar4 + -1] = 0;
              local_4 = 0;
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int fi(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype a     = userdata->a;
  sunrealtype b     = userdata->b;
  sunrealtype ep    = userdata->ep;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *f_u = NULL, *f_v = NULL, *f_w = NULL;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  f_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 0));
  if (check_flag((void*)f_u, "N_VGetArrayPointer", 0)) { return 1; }
  f_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 1));
  if (check_flag((void*)f_v, "N_VGetArrayPointer", 0)) { return 1; }
  f_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 2));
  if (check_flag((void*)f_w, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in ODE RHS for u */
    f_u[i] = a - (y_w[i] + ONE) * y_u[i] + y_v[i] * y_u[i] * y_u[i];

    /* Fill in ODE RHS for v */
    f_v[i] = y_w[i] * y_u[i] - y_v[i] * y_u[i] * y_u[i];

    /* Fill in ODE RHS for w */
    f_w[i] = (b - y_w[i]) / ep - y_w[i] * y_u[i];
  }

  /* enforce stationary boundaries */
  f_u[0] = f_v[0] = f_w[0] = ZERO;
  f_u[N - 1] = f_v[N - 1] = f_w[N - 1] = ZERO;

  return 0; /* Return with success */
}